

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpair.c
# Opt level: O2

int nn_xpair_create(void *hint,nn_sockbase **sockbase)

{
  nn_sockbase *self;
  
  self = (nn_sockbase *)nn_alloc_(0x28);
  if (self != (nn_sockbase *)0x0) {
    nn_sockbase_init(self,&nn_xpair_sockbase_vfptr,hint);
    nn_excl_init((nn_excl *)(self + 1));
    *sockbase = self;
    return 0;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/pair/xpair.c"
          ,0x95);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_xpair_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xpair *self;

    self = nn_alloc (sizeof (struct nn_xpair), "socket (pair)");
    alloc_assert (self);
    nn_xpair_init (self, &nn_xpair_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}